

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_high16_stage4_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i alVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  alVar34 = x[0x11];
  alVar43 = x[0x12];
  alVar1 = x[0x15];
  alVar2 = x[0x16];
  auVar31._0_12_ = alVar34._0_12_;
  auVar31._12_2_ = alVar34[0]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x1e] + 6);
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = alVar34._0_10_;
  auVar30._10_2_ = *(undefined2 *)((long)x[0x1e] + 4);
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = alVar34[0];
  auVar29._8_2_ = alVar34[0]._4_2_;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = *(undefined2 *)((long)x[0x1e] + 2);
  auVar28._4_2_ = alVar34[0]._2_2_;
  auVar28._0_2_ = (undefined2)alVar34[0];
  auVar28._2_2_ = (short)x[0x1e][0];
  auVar18._2_2_ = (short)x[0x1e][1];
  auVar18._0_2_ = (short)alVar34[1];
  auVar18._4_2_ = alVar34[1]._2_2_;
  auVar18._6_2_ = *(undefined2 *)((long)x[0x1e] + 10);
  auVar18._8_2_ = alVar34[1]._4_2_;
  auVar18._10_2_ = *(undefined2 *)((long)x[0x1e] + 0xc);
  auVar18._12_2_ = alVar34[1]._6_2_;
  auVar18._14_2_ = *(undefined2 *)((long)x[0x1e] + 0xe);
  auVar10._8_4_ = 0x31ff04f;
  auVar10._0_8_ = 0x31ff04f031ff04f;
  auVar10._12_4_ = 0x31ff04f;
  auVar39 = pmaddwd(auVar28,auVar10);
  auVar45 = pmaddwd(auVar18,auVar10);
  auVar47._8_4_ = 0xfb1031f;
  auVar47._0_8_ = 0xfb1031f0fb1031f;
  auVar47._12_4_ = 0xfb1031f;
  auVar32 = pmaddwd(auVar28,auVar47);
  auVar19 = pmaddwd(auVar18,auVar47);
  auVar40._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  auVar46._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar46._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar46._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar46._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar40,auVar46);
  auVar33._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar20._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar20._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar20._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar20._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar33,auVar20);
  x[0x11] = alVar41;
  x[0x1e] = alVar34;
  auVar24._0_12_ = alVar43._0_12_;
  auVar24._12_2_ = alVar43[0]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)x[0x1d] + 6);
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._0_10_ = alVar43._0_10_;
  auVar23._10_2_ = *(undefined2 *)((long)x[0x1d] + 4);
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._0_8_ = alVar43[0];
  auVar22._8_2_ = alVar43[0]._4_2_;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._6_2_ = *(undefined2 *)((long)x[0x1d] + 2);
  auVar21._4_2_ = alVar43[0]._2_2_;
  auVar21._0_2_ = (undefined2)alVar43[0];
  auVar21._2_2_ = (short)x[0x1d][0];
  auVar7._2_2_ = (short)x[0x1d][1];
  auVar7._0_2_ = (short)alVar43[1];
  auVar7._4_2_ = alVar43[1]._2_2_;
  auVar7._6_2_ = *(undefined2 *)((long)x[0x1d] + 10);
  auVar7._8_2_ = alVar43[1]._4_2_;
  auVar7._10_2_ = *(undefined2 *)((long)x[0x1d] + 0xc);
  auVar7._12_2_ = alVar43[1]._6_2_;
  auVar7._14_2_ = *(undefined2 *)((long)x[0x1d] + 0xe);
  auVar35._8_4_ = 0xf04ffce1;
  auVar35._0_8_ = 0xf04ffce1f04ffce1;
  auVar35._12_4_ = 0xf04ffce1;
  auVar45 = pmaddwd(auVar21,auVar35);
  auVar39 = pmaddwd(auVar35,auVar7);
  auVar32 = pmaddwd(auVar21,auVar10);
  auVar19 = pmaddwd(auVar7,auVar10);
  auVar42._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar36._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar36._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar36._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar36._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  alVar43 = (__m128i)packssdw(auVar42,auVar36);
  auVar25._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar25._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar25._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar25._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar8._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar8._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar8._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar8._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar25,auVar8);
  x[0x12] = alVar43;
  x[0x1d] = alVar34;
  auVar14._0_12_ = alVar1._0_12_;
  auVar14._12_2_ = alVar1[0]._6_2_;
  auVar14._14_2_ = *(undefined2 *)((long)x[0x1a] + 6);
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = alVar1._0_10_;
  auVar13._10_2_ = *(undefined2 *)((long)x[0x1a] + 4);
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = alVar1[0];
  auVar12._8_2_ = alVar1[0]._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = *(undefined2 *)((long)x[0x1a] + 2);
  auVar11._4_2_ = alVar1[0]._2_2_;
  auVar11._0_2_ = (undefined2)alVar1[0];
  auVar11._2_2_ = (short)x[0x1a][0];
  auVar39._2_2_ = (short)x[0x1a][1];
  auVar39._0_2_ = (short)alVar1[1];
  auVar39._4_2_ = alVar1[1]._2_2_;
  auVar39._6_2_ = *(undefined2 *)((long)x[0x1a] + 10);
  auVar39._8_2_ = alVar1[1]._4_2_;
  auVar39._10_2_ = *(undefined2 *)((long)x[0x1a] + 0xc);
  auVar39._12_2_ = alVar1[1]._6_2_;
  auVar39._14_2_ = *(undefined2 *)((long)x[0x1a] + 0xe);
  auVar9._8_4_ = 0xd4ef71c;
  auVar9._0_8_ = 0xd4ef71c0d4ef71c;
  auVar9._12_4_ = 0xd4ef71c;
  auVar45 = pmaddwd(auVar11,auVar9);
  auVar37 = pmaddwd(auVar39,auVar9);
  auVar44._8_4_ = 0x8e40d4e;
  auVar44._0_8_ = 0x8e40d4e08e40d4e;
  auVar44._12_4_ = 0x8e40d4e;
  auVar32 = pmaddwd(auVar11,auVar44);
  auVar19 = pmaddwd(auVar39,auVar44);
  auVar26._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar26._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar26._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar26._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar38._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  alVar43 = (__m128i)packssdw(auVar26,auVar38);
  auVar15._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar15._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar15._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar15._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar45._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar45._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar45._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar45._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar15,auVar45);
  x[0x15] = alVar43;
  x[0x1a] = alVar34;
  auVar5._0_12_ = alVar2._0_12_;
  auVar5._12_2_ = alVar2[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)x[0x19] + 6);
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_10_ = alVar2._0_10_;
  auVar4._10_2_ = *(undefined2 *)((long)x[0x19] + 4);
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_8_ = alVar2[0];
  auVar3._8_2_ = alVar2[0]._4_2_;
  auVar37._8_8_ = auVar3._8_8_;
  auVar37._6_2_ = *(undefined2 *)((long)x[0x19] + 2);
  auVar37._4_2_ = alVar2[0]._2_2_;
  auVar37._0_2_ = (undefined2)alVar2[0];
  auVar37._2_2_ = (short)x[0x19][0];
  auVar19._2_2_ = (short)x[0x19][1];
  auVar19._0_2_ = (short)alVar2[1];
  auVar19._4_2_ = alVar2[1]._2_2_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x19] + 10);
  auVar19._8_2_ = alVar2[1]._4_2_;
  auVar19._10_2_ = *(undefined2 *)((long)x[0x19] + 0xc);
  auVar19._12_2_ = alVar2[1]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)x[0x19] + 0xe);
  auVar16._8_4_ = 0xf71cf2b2;
  auVar16._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar16._12_4_ = 0xf71cf2b2;
  auVar45 = pmaddwd(auVar37,auVar16);
  auVar39 = pmaddwd(auVar16,auVar19);
  auVar32 = pmaddwd(auVar37,auVar9);
  auVar19 = pmaddwd(auVar19,auVar9);
  auVar27._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar27._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar27._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar27._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar17._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  alVar43 = (__m128i)packssdw(auVar27,auVar17);
  auVar6._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar6._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar6._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar6._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar32._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar6,auVar32);
  x[0x16] = alVar43;
  x[0x19] = alVar34;
  return;
}

Assistant:

static inline void idct32_high16_stage4_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m56_m08 = pair_set_epi16(-cospi[56], -cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_m56_m08, cospi_m08_p56, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_m40_p24, cospi_p24_p40, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[22], x[25], x[22], x[25]);
}